

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O1

void __thiscall
PersistentStorageJsonTestSuite_DelBorderRouter_Test::
~PersistentStorageJsonTestSuite_DelBorderRouter_Test
          (PersistentStorageJsonTestSuite_DelBorderRouter_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, DelBorderRouter)
{
    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    EXPECT_TRUE(psj.Del(BorderRouterId(0)) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Del(BorderRouterId(1)) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Del(BorderRouterId(2)) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Del(BorderRouterId(50)) == PersistentStorage::Status::kSuccess);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}